

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Propagator.h
# Opt level: O2

SpanContext * __thiscall
jaegertracing::propagation::BinaryPropagator::extract
          (SpanContext *__return_storage_ptr__,BinaryPropagator *this,istream *in)

{
  uint uVar1;
  _Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
  _Var2;
  type_conflict tVar3;
  type tVar4;
  type parentID;
  long *plVar5;
  mapped_type *pmVar6;
  int iVar7;
  char ch;
  string key;
  string value;
  TraceID traceID;
  StrMap baggage;
  
  tVar4 = readBinary<unsigned_long>(in);
  traceID._low = readBinary<unsigned_long>(in);
  traceID._high = tVar4;
  tVar4 = readBinary<unsigned_long>(in);
  parentID = readBinary<unsigned_long>(in);
  std::istream::get((char *)in);
  tVar3 = readBinary<unsigned_int>(in);
  baggage._M_h._M_buckets = &baggage._M_h._M_single_bucket;
  baggage._M_h._M_bucket_count = 1;
  baggage._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  baggage._M_h._M_element_count = 0;
  baggage._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  baggage._M_h._M_rehash_policy._M_next_resize = 0;
  baggage._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::__detail::
  _Rehash_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
  ::reserve((_Rehash_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_std::integral_constant<bool,_true>_>
             *)&baggage,(ulong)tVar3);
  iVar7 = tVar3 + 1;
  do {
    iVar7 = iVar7 + -1;
    if (iVar7 == 0) {
      std::__cxx11::string::string((string *)&key,"",(allocator *)&value);
      SpanContext::SpanContext(__return_storage_ptr__,&traceID,tVar4,parentID,'\0',&baggage,&key);
LAB_001f7e89:
      std::__cxx11::string::~string((string *)&key);
      break;
    }
    tVar3 = readBinary<unsigned_int>(in);
    key._M_dataplus._M_p = (pointer)&key.field_2;
    std::__cxx11::string::_M_construct((ulong)&key,(char)tVar3);
    plVar5 = (long *)std::istream::read((char *)in,(long)key._M_dataplus._M_p);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
      _Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
           (((this->_metrics).
             super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->_decodingErrors)._M_t.
           super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
           .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
      (**(code **)(*(long *)_Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                            _M_head_impl + 0x10))
                (_Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl,
                 1);
      SpanContext::SpanContext(__return_storage_ptr__);
      goto LAB_001f7e89;
    }
    tVar3 = readBinary<unsigned_int>(in);
    value._M_dataplus._M_p = (pointer)&value.field_2;
    std::__cxx11::string::_M_construct((ulong)&value,(char)tVar3);
    plVar5 = (long *)std::istream::read((char *)in,(long)value._M_dataplus._M_p);
    uVar1 = *(uint *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20);
    if ((uVar1 & 5) == 0) {
      pmVar6 = std::__detail::
               _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
               ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                             *)&baggage,&key);
      std::__cxx11::string::_M_assign((string *)pmVar6);
    }
    else {
      _Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl =
           (((this->_metrics).
             super___shared_ptr<jaegertracing::metrics::Metrics,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
           ->_decodingErrors)._M_t.
           super___uniq_ptr_impl<jaegertracing::metrics::Counter,_std::default_delete<jaegertracing::metrics::Counter>_>
           ._M_t.
           super__Tuple_impl<0UL,_jaegertracing::metrics::Counter_*,_std::default_delete<jaegertracing::metrics::Counter>_>
           .super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>;
      (**(code **)(*(long *)_Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>.
                            _M_head_impl + 0x10))
                (_Var2.super__Head_base<0UL,_jaegertracing::metrics::Counter_*,_false>._M_head_impl,
                 1);
      SpanContext::SpanContext(__return_storage_ptr__);
    }
    std::__cxx11::string::~string((string *)&value);
    std::__cxx11::string::~string((string *)&key);
  } while ((uVar1 & 5) == 0);
  std::
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  ::~_Hashtable(&baggage._M_h);
  return __return_storage_ptr__;
}

Assistant:

SpanContext extract(std::istream& in) const override
    {
        const auto traceIDHigh = readBinary<uint64_t>(in);
        const auto traceIDLow = readBinary<uint64_t>(in);
        TraceID traceID(traceIDHigh, traceIDLow);
        const auto spanID = readBinary<uint64_t>(in);
        const auto parentID = readBinary<uint64_t>(in);

        auto ch = '\0';
        in.get(ch);
        const auto flags = static_cast<unsigned char>(ch);

        const auto numBaggageItems = readBinary<uint32_t>(in);
        StrMap baggage;
        baggage.reserve(numBaggageItems);
        for (auto i = static_cast<uint32_t>(0); i < numBaggageItems; ++i) {
            const auto keyLength = readBinary<uint32_t>(in);
            std::string key(keyLength, '\0');
            if (!in.read(&key[0], keyLength)) {
                _metrics->decodingErrors().inc(1);
                return SpanContext();
            }

            const auto valueLength = readBinary<uint32_t>(in);
            std::string value(valueLength, '\0');
            if (!in.read(&value[0], valueLength)) {
                _metrics->decodingErrors().inc(1);
                return SpanContext();
            }

            baggage[key] = value;
        }

        SpanContext ctx(traceID, spanID, parentID, flags, baggage);
        return ctx;
    }